

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginPopupModal(char *name,bool *p_open,ImGuiWindowFlags flags)

{
  bool bVar1;
  bool is_open;
  ImVec2 local_44;
  ImGuiID local_3c;
  ImGuiWindow *pIStack_38;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  bool *pbStack_20;
  ImGuiWindowFlags flags_local;
  bool *p_open_local;
  char *name_local;
  
  window = (ImGuiWindow *)GImGui;
  pIStack_38 = GImGui->CurrentWindow;
  g._4_4_ = flags;
  pbStack_20 = p_open;
  p_open_local = (bool *)name;
  local_3c = ImGuiWindow::GetID(pIStack_38,name,(char *)0x0);
  bVar1 = IsPopupOpen(local_3c);
  if (bVar1) {
    if ((window[7].NameBufLen & 1U) == 0) {
      local_44 = ::operator*(&window->Pos,0.5);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffb4,0.5,0.5);
      SetNextWindowPos(&local_44,8,(ImVec2 *)&stack0xffffffffffffffb4);
    }
    g._4_4_ = g._4_4_ | 0xc000120;
    name_local._7_1_ = Begin(p_open_local,pbStack_20,g._4_4_);
    if ((!name_local._7_1_) || ((pbStack_20 != (bool *)0x0 && ((*pbStack_20 & 1U) == 0)))) {
      EndPopup();
      if (name_local._7_1_) {
        ClosePopupToLevel((int)window[7].DC.CurrLineSize.x,true);
      }
      name_local._7_1_ = false;
    }
  }
  else {
    ImGuiNextWindowData::ClearFlags((ImGuiNextWindowData *)&window[7].NameBufLen);
    name_local._7_1_ = false;
  }
  return name_local._7_1_;
}

Assistant:

bool ImGui::BeginPopupModal(const char* name, bool* p_open, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiID id = window->GetID(name);
    if (!IsPopupOpen(id))
    {
        g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
        return false;
    }

    // Center modal windows by default
    // FIXME: Should test for (PosCond & window->SetWindowPosAllowFlags) with the upcoming window.
    if ((g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasPos) == 0)
        SetNextWindowPos(g.IO.DisplaySize * 0.5f, ImGuiCond_Appearing, ImVec2(0.5f, 0.5f));

    flags |= ImGuiWindowFlags_Popup | ImGuiWindowFlags_Modal | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoSavedSettings;
    const bool is_open = Begin(name, p_open, flags);
    if (!is_open || (p_open && !*p_open)) // NB: is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
    {
        EndPopup();
        if (is_open)
            ClosePopupToLevel(g.BeginPopupStack.Size, true);
        return false;
    }
    return is_open;
}